

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model
          (raw_quasi_adaptive_huffman_data_model *this)

{
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    lzham_delete<lzham::prefix_coding::decoder_tables>(this->m_pDecode_tables);
  }
  vector<unsigned_char>::~vector(&this->m_code_sizes);
  vector<unsigned_short>::~vector(&this->m_codes);
  vector<unsigned_short>::~vector(&this->m_sym_freq);
  return;
}

Assistant:

raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model()
   {
      if (m_pDecode_tables)
         lzham_delete(m_pDecode_tables);
   }